

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::PreLowerCanonicalize(GlobOpt *this,Instr *instr,Value **pSrc1Val,Value **pSrc2Val)

{
  Value *pVVar1;
  bool bVar2;
  Instr *this_00;
  Opnd *pOVar3;
  RegOpnd *pRVar4;
  byte local_9a;
  byte local_99;
  byte local_98;
  byte local_97;
  byte local_96;
  byte local_95;
  byte local_94;
  byte local_93;
  byte local_92;
  byte local_91;
  byte local_82;
  byte local_81;
  Instr *newInstr;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_68;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_66;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_64;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a [5];
  Value *tempVal;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  OpCode opcode;
  Opnd *local_40;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Value **pSrc2Val_local;
  Value **pSrc1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  dst = (Opnd *)pSrc2Val;
  pSrc2Val_local = pSrc1Val;
  pSrc1Val_local = (Value **)instr;
  instr_local = (Instr *)this;
  src1 = IR::Instr::GetDst(instr);
  src2 = IR::Instr::GetSrc1((Instr *)pSrc1Val_local);
  local_40 = IR::Instr::GetSrc2((Instr *)pSrc1Val_local);
  bVar2 = IR::Opnd::IsImmediateOpnd(src2);
  if (!bVar2) {
    if (local_40 == (Opnd *)0x0) {
      return;
    }
    if (src1 == (Opnd *)0x0) {
      return;
    }
    bVar2 = IR::Opnd::IsRegOpnd(local_40);
    if (!bVar2) {
      return;
    }
    bVar2 = IR::Opnd::GetIsDead(local_40);
    if ((((!bVar2) || (bVar2 = IR::Opnd::GetIsDead(src2), bVar2)) ||
        (bVar2 = IR::Opnd::IsEqual(src2,src1), bVar2)) &&
       (bVar2 = IR::Opnd::IsEqual(local_40,src1), !bVar2)) {
      return;
    }
    bVar2 = OpCodeAttr::OpndHasImplicitCall(*(OpCode *)(pSrc1Val_local + 6));
    if (bVar2) {
      bVar2 = IR::Instr::IsBranchInstr((Instr *)pSrc1Val_local);
      if (bVar2) {
        opcode = (OpCode)IR::Opnd::GetValueType(src2);
        bVar2 = ValueType::IsPrimitive((ValueType *)&opcode);
        local_81 = 1;
        if (bVar2) {
          local_44.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(local_40);
          bVar2 = ValueType::IsPrimitive((ValueType *)&local_44.field_0);
          local_81 = bVar2 ^ 0xff;
        }
      }
      else {
        local_46.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(src2);
        bVar2 = ValueType::IsPrimitive((ValueType *)&local_46.field_0);
        local_82 = 0;
        local_81 = local_82;
        if (!bVar2) {
          local_48.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(local_40);
          bVar2 = ValueType::IsPrimitive((ValueType *)&local_48.field_0);
          local_81 = bVar2 ^ 0xff;
        }
      }
      if ((local_81 & 1) != 0) {
        return;
      }
    }
  }
  tempVal._6_2_ = *(undefined2 *)(pSrc1Val_local + 6);
  switch(tempVal._6_2_) {
  case 7:
  case 10:
  case 0x24:
  case 0x45:
  case 0x59:
  case 0x70:
  case 0x72:
  case 0x7a:
  case 0x7e:
  case 0x9a:
  case 0x9c:
  case 0xbe:
  case 0xbf:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd1:
  case 0xd2:
  case 0xd4:
  case 0xd6:
  case 0xd7:
  case 0xd9:
  case 0xe2:
  case 0xe3:
  case 0xfd:
  case 0x169:
  case 0x173:
  case 0x174:
  case 0x1bb:
  case 0x1be:
  case 0x1bf:
  case 0x1c1:
  case 0x1de:
  case 0x1df:
  case 0x1e0:
  case 0x1e3:
  case 0x1e4:
  case 0x1e5:
  case 0x1ed:
  case 0x1ee:
  case 0x1ef:
  case 0x1f0:
  case 0x1f1:
  case 499:
  case 0x1f7:
  case 0x1f8:
  case 0x1fe:
  case 0x21c:
  case 0x21d:
  case 0x21f:
  case 0x224:
  case 0x226:
  case 0x22c:
  case 0x22d:
  case 0x22e:
  case 0x230:
  case 0x231:
  case 0x248:
  case 0x24a:
  case 0x24b:
  case 0x24d:
  case 0x24e:
  case 0x277:
  case 0x28b:
  case 0x28c:
  case 0x28d:
  case 0x28e:
    return;
  default:
    goto switchD_0058ad7c_caseD_8;
  case 0xc:
  case 0x3b:
  case 0x40:
  case 0x195:
    bVar2 = IR::Opnd::IsImmediateOpnd(src2);
    local_91 = 0;
    if (!bVar2) {
      local_5a[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2);
      bVar2 = ValueType::IsPrimitive((ValueType *)&local_5a[0].field_0);
      local_92 = 1;
      if (bVar2) {
        local_5c.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_40);
        bVar2 = ValueType::IsPrimitive((ValueType *)&local_5c.field_0);
        local_92 = bVar2 ^ 0xff;
      }
      local_91 = local_92;
    }
    if ((local_91 & 1) != 0) {
      return;
    }
    break;
  case 0xd:
  case 0x15:
  case 0x194:
  case 0x196:
  case 0x1b0:
    break;
  case 0x10:
    tempVal._6_2_ = 0x13;
    break;
  case 0x11:
    tempVal._6_2_ = 0x12;
    break;
  case 0x12:
    tempVal._6_2_ = 0x11;
    break;
  case 0x13:
    tempVal._6_2_ = 0x10;
    break;
  case 0x14:
  case 0x197:
  case 0x1a5:
    break;
  case 0x1f:
  case 0xc4:
  case 199:
  case 0xc9:
  case 0x160:
  case 0x215:
  case 0x26f:
    bVar2 = IR::Instr::HasFixedFunctionAddressTarget((Instr *)pSrc1Val_local);
    if (bVar2) {
      return;
    }
    goto switchD_0058ad7c_caseD_8;
  case 0x2d:
    bVar2 = IR::Opnd::IsFloat(src2);
    if (!bVar2) {
      return;
    }
    break;
  case 0x30:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x1c0:
  case 0x1c2:
  case 0x1c7:
  case 0x1c8:
  case 0x1c9:
    break;
  case 0x3c:
    bVar2 = IR::Opnd::IsImmediateOpnd(src2);
    local_93 = 0;
    if (!bVar2) {
      local_5e.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2);
      bVar2 = ValueType::IsPrimitive((ValueType *)&local_5e.field_0);
      local_94 = 1;
      if (bVar2) {
        local_60.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_40);
        bVar2 = ValueType::IsPrimitive((ValueType *)&local_60.field_0);
        local_94 = bVar2 ^ 0xff;
      }
      local_93 = local_94;
    }
    if ((local_93 & 1) != 0) {
      return;
    }
    tempVal._6_2_ = 0x3f;
    break;
  case 0x3d:
    bVar2 = IR::Opnd::IsImmediateOpnd(src2);
    local_95 = 0;
    if (!bVar2) {
      local_62.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2);
      bVar2 = ValueType::IsPrimitive((ValueType *)&local_62.field_0);
      local_96 = 1;
      if (bVar2) {
        local_64.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_40);
        bVar2 = ValueType::IsPrimitive((ValueType *)&local_64.field_0);
        local_96 = bVar2 ^ 0xff;
      }
      local_95 = local_96;
    }
    if ((local_95 & 1) != 0) {
      return;
    }
    tempVal._6_2_ = 0x3e;
    break;
  case 0x3e:
    bVar2 = IR::Opnd::IsImmediateOpnd(src2);
    local_99 = 0;
    if (!bVar2) {
      newInstr._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2);
      bVar2 = ValueType::IsPrimitive((ValueType *)((long)&newInstr + 6));
      local_9a = 1;
      if (bVar2) {
        newInstr._4_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_40);
        bVar2 = ValueType::IsPrimitive((ValueType *)((long)&newInstr + 4));
        local_9a = bVar2 ^ 0xff;
      }
      local_99 = local_9a;
    }
    if ((local_99 & 1) != 0) {
      return;
    }
    tempVal._6_2_ = 0x3d;
    break;
  case 0x3f:
    bVar2 = IR::Opnd::IsImmediateOpnd(src2);
    local_97 = 0;
    if (!bVar2) {
      local_66.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2);
      bVar2 = ValueType::IsPrimitive((ValueType *)&local_66.field_0);
      local_98 = 1;
      if (bVar2) {
        local_68.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_40);
        bVar2 = ValueType::IsPrimitive((ValueType *)&local_68.field_0);
        local_98 = bVar2 ^ 0xff;
      }
      local_97 = local_98;
    }
    if ((local_97 & 1) != 0) {
      return;
    }
    tempVal._6_2_ = 0x3c;
    break;
  case 0x198:
    tempVal._6_2_ = 0x19b;
    break;
  case 0x199:
    tempVal._6_2_ = 0x19a;
    break;
  case 0x19a:
    tempVal._6_2_ = 0x199;
    break;
  case 0x19b:
    tempVal._6_2_ = 0x198;
    break;
  case 0x1a8:
    tempVal._6_2_ = 0x1ae;
    break;
  case 0x1aa:
    tempVal._6_2_ = 0x1ac;
    break;
  case 0x1ac:
    tempVal._6_2_ = 0x1aa;
    break;
  case 0x1ae:
    tempVal._6_2_ = 0x1a8;
  }
  pOVar3 = IR::Instr::GetSrc2((Instr *)pSrc1Val_local);
  bVar2 = IR::Opnd::IsImmediateOpnd(pOVar3);
  if (bVar2) {
switchD_0058ad7c_caseD_8:
    bVar2 = IR::Opnd::IsImmediateOpnd(src2);
    if (bVar2) {
      bVar2 = IR::Opnd::IsIntConstOpnd(src2);
      if (bVar2) {
        this_00 = IR::Instr::HoistSrc1((Instr *)pSrc1Val_local,Ld_I4,RegNOREG,(StackSym *)0x0);
        pOVar3 = IR::Instr::GetDst(this_00);
        pRVar4 = IR::Opnd::AsRegOpnd(pOVar3);
        ToInt32Dst(this,this_00,pRVar4,this->currentBlock);
      }
      else {
        bVar2 = IR::Opnd::IsInt64ConstOpnd(src2);
        if (bVar2) {
          IR::Instr::HoistSrc1((Instr *)pSrc1Val_local,Ld_I4,RegNOREG,(StackSym *)0x0);
        }
        else {
          IR::Instr::HoistSrc1((Instr *)pSrc1Val_local,Ld_A,RegNOREG,(StackSym *)0x0);
        }
      }
      src2 = IR::Instr::GetSrc1((Instr *)pSrc1Val_local);
      pRVar4 = IR::Opnd::AsRegOpnd(src2);
      StackSym::SetIsConst(pRVar4->m_sym);
    }
  }
  else {
    *(undefined2 *)(pSrc1Val_local + 6) = tempVal._6_2_;
    IR::Instr::SwapOpnds((Instr *)pSrc1Val_local);
    pVVar1 = *pSrc2Val_local;
    *pSrc2Val_local = (Value *)dst->_vptr_Opnd;
    dst->_vptr_Opnd = (_func_int **)pVVar1;
  }
  return;
}

Assistant:

void
GlobOpt::PreLowerCanonicalize(IR::Instr *instr, Value **pSrc1Val, Value **pSrc2Val)
{
    IR::Opnd *dst = instr->GetDst();
    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    if (src1->IsImmediateOpnd())
    {
        // Swap for dst, src
    }
    else if (src2 && dst && src2->IsRegOpnd())
    {
        if (src2->GetIsDead() && !src1->GetIsDead() && !src1->IsEqual(dst))
        {
            // Swap if src2 is dead, as the reg can be reuse for the dst for opEqs like on x86 (ADD r1, r2)
        }
        else if (src2->IsEqual(dst))
        {
            // Helps lowering of opEqs
        }
        else
        {
            return;
        }
        // Make sure we don't swap 2 srcs with valueOf calls.
        if (OpCodeAttr::OpndHasImplicitCall(instr->m_opcode))
        {
            if (instr->IsBranchInstr())
            {
                if (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive())
                {
                    return;
                }
            }
            else if (!src1->GetValueType().IsPrimitive() && !src2->GetValueType().IsPrimitive())
            {
                return;
            }
        }
    }
    else
    {
        return;
    }
    Js::OpCode opcode = instr->m_opcode;
    switch (opcode)
    {
    case Js::OpCode::And_A:
    case Js::OpCode::Mul_A:
    case Js::OpCode::Or_A:
    case Js::OpCode::Xor_A:
    case Js::OpCode::And_I4:
    case Js::OpCode::Mul_I4:
    case Js::OpCode::Or_I4:
    case Js::OpCode::Xor_I4:
    case Js::OpCode::Add_I4:
swap_srcs:
        if (!instr->GetSrc2()->IsImmediateOpnd())
        {
            instr->m_opcode = opcode;
            instr->SwapOpnds();

            Value *tempVal = *pSrc1Val;
            *pSrc1Val = *pSrc2Val;
            *pSrc2Val = tempVal;
            return;
        }
        break;

    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrEq_I4:
        goto swap_srcs;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNeq_I4:
        goto swap_srcs;

    case Js::OpCode::BrGe_A:
        opcode = Js::OpCode::BrLe_A;
        goto swap_srcs;

    case Js::OpCode::BrNotGe_A:
        opcode = Js::OpCode::BrNotLe_A;
        goto swap_srcs;

    case Js::OpCode::BrGe_I4:
        opcode = Js::OpCode::BrLe_I4;
        goto swap_srcs;

    case Js::OpCode::BrGt_A:
        opcode = Js::OpCode::BrLt_A;
        goto swap_srcs;

    case Js::OpCode::BrNotGt_A:
        opcode = Js::OpCode::BrNotLt_A;
        goto swap_srcs;

    case Js::OpCode::BrGt_I4:
        opcode = Js::OpCode::BrLt_I4;
        goto swap_srcs;

    case Js::OpCode::BrLe_A:
        opcode = Js::OpCode::BrGe_A;
        goto swap_srcs;

    case Js::OpCode::BrNotLe_A:
        opcode = Js::OpCode::BrNotGe_A;
        goto swap_srcs;

    case Js::OpCode::BrLe_I4:
        opcode = Js::OpCode::BrGe_I4;
        goto swap_srcs;

    case Js::OpCode::BrLt_A:
        opcode = Js::OpCode::BrGt_A;
        goto swap_srcs;

    case Js::OpCode::BrNotLt_A:
        opcode = Js::OpCode::BrNotGt_A;
        goto swap_srcs;

    case Js::OpCode::BrLt_I4:
        opcode = Js::OpCode::BrGt_I4;
        goto swap_srcs;

    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmNeq_A:
        // this == "" not the same as "" == this...
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        goto swap_srcs;

    case Js::OpCode::CmGe_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmLe_A;
        goto swap_srcs;

    case Js::OpCode::CmGt_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmLt_A;
        goto swap_srcs;

    case Js::OpCode::CmLe_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmGe_A;
        goto swap_srcs;

    case Js::OpCode::CmLt_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmGt_A;
        goto swap_srcs;

    case Js::OpCode::CallI:
    case Js::OpCode::CallIFixed:
    case Js::OpCode::NewScObject:
    case Js::OpCode::NewScObjectSpread:
    case Js::OpCode::NewScObjArray:
    case Js::OpCode::NewScObjArraySpread:
    case Js::OpCode::NewScObjectNoCtor:
        // Don't insert load to register if the function operand is a fixed function.
        if (instr->HasFixedFunctionAddressTarget())
        {
            return;
        }
        break;

        // Can't do add because <32 + "Hello"> isn't equal to <"Hello" + 32>
        // Lower can do the swap. Other op-codes listed below don't need immediate source hoisting, as the fast paths handle it,
        // or the lowering handles the hoisting.
    case Js::OpCode::Add_A:
        if (src1->IsFloat())
        {
            goto swap_srcs;
        }
        return;

    case Js::OpCode::Sub_I4:
    case Js::OpCode::Neg_I4:
    case Js::OpCode::Not_I4:
    case Js::OpCode::NewScFunc:
    case Js::OpCode::NewScGenFunc:
    case Js::OpCode::NewScFuncHomeObj:
    case Js::OpCode::NewScGenFuncHomeObj:
    case Js::OpCode::NewScArray:
    case Js::OpCode::NewScIntArray:
    case Js::OpCode::NewScFltArray:
    case Js::OpCode::NewScArrayWithMissingValues:
    case Js::OpCode::NewRegEx:
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::ThrowRuntimeError:
    case Js::OpCode::TrapIfMinIntOverNegOne:
    case Js::OpCode::TrapIfTruncOverflow:
    case Js::OpCode::TrapIfZero:
    case Js::OpCode::TrapIfUnalignedAccess:
    case Js::OpCode::FromVar:
    case Js::OpCode::Conv_Prim:
    case Js::OpCode::Conv_Prim_Sat:
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::LdStr:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::StartCall:
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_InlineSpecialized:
    case Js::OpCode::ArgOut_A_SpreadArg:
    case Js::OpCode::InlineeEnd:
    case Js::OpCode::EndCallForPolymorphicInlinee:
    case Js::OpCode::InlineeMetaArg:
    case Js::OpCode::InlineBuiltInEnd:
    case Js::OpCode::InlineNonTrackingBuiltInEnd:
    case Js::OpCode::CallHelper:
    case Js::OpCode::LdElemUndef:
    case Js::OpCode::LdElemUndefScoped:
    case Js::OpCode::RuntimeTypeError:
    case Js::OpCode::RuntimeReferenceError:
    case Js::OpCode::Ret:
    case Js::OpCode::NewScObjectSimple:
    case Js::OpCode::NewScObjectLiteral:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StElemC:
    case Js::OpCode::StArrSegElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::CallDirect:
    case Js::OpCode::BrNotHasSideEffects:
    case Js::OpCode::NewConcatStrMulti:
    case Js::OpCode::NewConcatStrMultiBE:
    case Js::OpCode::ExtendArg_A:
    case Js::OpCode::NewScopeSlots:
    case Js::OpCode::NewScopeSlotsWithoutPropIds:
    case Js::OpCode::NewStackScopeSlots:
    case Js::OpCode::IsInst:
    case Js::OpCode::BailOnEqual:
    case Js::OpCode::BailOnNotEqual:
    case Js::OpCode::StArrViewElem:
        return;
    }

    if (!src1->IsImmediateOpnd())
    {
        return;
    }

    // The fast paths or lowering of the remaining instructions may not support handling immediate opnds for the first src. The
    // immediate src1 is hoisted here into a separate instruction.
    if (src1->IsIntConstOpnd())
    {
        IR::Instr *newInstr = instr->HoistSrc1(Js::OpCode::Ld_I4);
        ToInt32Dst(newInstr, newInstr->GetDst()->AsRegOpnd(), this->currentBlock);
    }
    else if (src1->IsInt64ConstOpnd())
    {
        instr->HoistSrc1(Js::OpCode::Ld_I4);
    }
    else
    {
        instr->HoistSrc1(Js::OpCode::Ld_A);
    }
    src1 = instr->GetSrc1();
    src1->AsRegOpnd()->m_sym->SetIsConst();
}